

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_log_module.c
# Opt level: O2

char * ngx_http_log_compile_format
                 (ngx_conf_t *cf,ngx_array_t *flushes,ngx_array_t *ops,ngx_array_t *args,
                 ngx_uint_t s)

{
  ulong uVar1;
  char cVar2;
  byte bVar3;
  ulong uVar4;
  ngx_http_log_op_run_pt p_Var5;
  int iVar6;
  size_t *psVar7;
  size_t sVar8;
  void *pvVar9;
  ulong uVar10;
  char *pcVar11;
  u_char *__s2;
  ngx_str_t *__s1;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  ngx_http_log_op_run_pt *pp_Var15;
  ulong uVar16;
  long lVar17;
  ngx_uint_t nVar18;
  size_t __n;
  ulong uVar19;
  ngx_str_t local_98;
  ngx_array_t *local_88;
  ulong local_80;
  ngx_array_t *local_78;
  void *local_70;
  ngx_array_t *local_68;
  code *local_60;
  code *local_58;
  char *local_50;
  size_t *local_48;
  ulong *local_40;
  ngx_conf_t *local_38;
  
  pvVar9 = args->elts;
  nVar18 = args->nelts;
  local_60 = ngx_http_log_variable;
  local_58 = ngx_http_log_variable_getlen;
  local_50 = (char *)0xffffffffffffffff;
  local_88 = ops;
  local_78 = args;
  local_68 = flushes;
  local_38 = cf;
  if (s < nVar18) {
    pcVar11 = *(char **)((long)pvVar9 + s * 0x10 + 8);
    iVar6 = strncmp(pcVar11,"escape=",7);
    if (iVar6 == 0) {
      __s1 = (ngx_str_t *)(pcVar11 + 7);
      iVar6 = strcmp((char *)__s1,"json");
      if (iVar6 == 0) {
        s = s + 1;
        local_60 = ngx_http_log_json_variable;
        local_58 = ngx_http_log_json_variable_getlen;
      }
      else {
        iVar6 = strcmp((char *)__s1,"default");
        if (iVar6 != 0) {
          pcVar11 = "unknown log format escaping \"%s\"";
LAB_00142ee5:
          ngx_conf_log_error(1,local_38,0,pcVar11,__s1);
          return local_50;
        }
        s = s + 1;
      }
    }
  }
  do {
    local_70 = pvVar9;
    if (nVar18 <= s) {
      return (char *)0x0;
    }
    local_40 = (ulong *)(s * 0x10 + (long)local_70);
    puVar14 = local_40;
    uVar13 = 0;
    local_80 = s;
LAB_00142c4e:
    uVar19 = uVar13;
    if (uVar19 < *puVar14) {
      psVar7 = (size_t *)ngx_array_push(local_88);
      if (psVar7 == (size_t *)0x0) {
        return local_50;
      }
      uVar4 = puVar14[1];
      __s1 = (ngx_str_t *)(uVar4 + uVar19);
      if (*(char *)(uVar4 + uVar19) == '$') {
        uVar16 = uVar19 + 1;
        uVar12 = *puVar14;
        local_48 = psVar7;
        if ((uVar16 == uVar12) ||
           ((cVar2 = *(char *)(uVar4 + uVar16), cVar2 == '{' &&
            (uVar16 = uVar19 + 2, uVar16 == uVar12)))) {
LAB_00142ed5:
          pcVar11 = "invalid parameter \"%s\"";
          goto LAB_00142ee5;
        }
        __s2 = (u_char *)(uVar4 + uVar16);
        lVar17 = -1;
        for (__n = 0; uVar13 = uVar16 + __n, local_98.len = __n, local_98.data = __s2,
            uVar13 < uVar12; __n = __n + 1) {
          bVar3 = *(byte *)(uVar4 + uVar16 + __n);
          if ((cVar2 == '{') && (bVar3 == 0x7d)) {
            uVar13 = uVar16 - lVar17;
            goto LAB_00142dad;
          }
          if ((0x19 < (byte)((bVar3 & 0xdf) + 0xbf)) && (bVar3 != 0x5f && 9 < (byte)(bVar3 - 0x30)))
          break;
          lVar17 = lVar17 + -1;
        }
        if (cVar2 == '{') {
          pcVar11 = "the closing bracket in \"%V\" variable is missing";
          __s1 = &local_98;
          goto LAB_00142ee5;
        }
LAB_00142dad:
        if (__n == 0) goto LAB_00142ed5;
        pp_Var15 = &ngx_http_log_vars[0].run;
        while (sVar8 = (((ngx_http_log_var_t *)(pp_Var15 + -3))->name).len, sVar8 != 0) {
          if ((sVar8 + lVar17 == -1) &&
             (iVar6 = strncmp((char *)pp_Var15[-2],(char *)__s2,__n), iVar6 == 0)) {
            p_Var5 = *pp_Var15;
            *local_48 = (size_t)pp_Var15[-1];
            local_48[1] = 0;
            local_48[2] = (size_t)p_Var5;
            local_48[3] = 0;
            puVar14 = local_40;
            goto LAB_00142c4e;
          }
          pp_Var15 = pp_Var15 + 4;
        }
        sVar8 = ngx_http_get_variable_index(local_38,&local_98);
        puVar14 = local_40;
        if (sVar8 == 0xffffffffffffffff) {
          return local_50;
        }
        *local_48 = 0;
        local_48[1] = (size_t)local_58;
        local_48[2] = (size_t)local_60;
        local_48[3] = sVar8;
        if (local_68 != (ngx_array_t *)0x0) {
          psVar7 = (size_t *)ngx_array_push(local_68);
          if (psVar7 == (size_t *)0x0) {
            return local_50;
          }
          *psVar7 = local_48[3];
        }
      }
      else {
        uVar16 = *puVar14;
        uVar12 = uVar19;
        uVar10 = uVar19 + 1;
        if (uVar19 + 1 < uVar16) {
          uVar10 = uVar16;
        }
        do {
          uVar1 = uVar12 + 1;
          uVar13 = uVar10;
          if (uVar16 <= uVar1) break;
          pcVar11 = (char *)(uVar4 + 1 + uVar12);
          uVar12 = uVar1;
          uVar13 = uVar1;
        } while (*pcVar11 != '$');
        uVar16 = uVar13 - uVar19;
        if (uVar16 != 0) {
          *psVar7 = uVar16;
          psVar7[1] = 0;
          if (uVar16 < 9) {
            psVar7[2] = (size_t)ngx_http_log_copy_short;
            sVar8 = 0;
            for (uVar16 = uVar13; psVar7[3] = sVar8, uVar19 != uVar16; uVar16 = uVar16 - 1) {
              psVar7[3] = sVar8 << 8;
              sVar8 = sVar8 << 8 | (ulong)*(byte *)((uVar4 - 1) + uVar16);
            }
          }
          else {
            psVar7[2] = (size_t)ngx_http_log_copy_long;
            pvVar9 = ngx_pnalloc(local_38->pool,uVar16);
            if (pvVar9 == (void *)0x0) {
              return local_50;
            }
            memcpy(pvVar9,__s1,uVar16);
            psVar7[3] = (size_t)pvVar9;
            puVar14 = local_40;
          }
        }
      }
      goto LAB_00142c4e;
    }
    s = local_80 + 1;
    nVar18 = local_78->nelts;
    pvVar9 = local_70;
  } while( true );
}

Assistant:

static char *
ngx_http_log_compile_format(ngx_conf_t *cf, ngx_array_t *flushes,
    ngx_array_t *ops, ngx_array_t *args, ngx_uint_t s)
{
    u_char              *data, *p, ch;
    size_t               i, len;
    ngx_str_t           *value, var;
    ngx_int_t           *flush;
    ngx_uint_t           bracket, json;
    ngx_http_log_op_t   *op;
    ngx_http_log_var_t  *v;

    json = 0;
    value = args->elts;

    if (s < args->nelts && ngx_strncmp(value[s].data, "escape=", 7) == 0) {
        data = value[s].data + 7;

        if (ngx_strcmp(data, "json") == 0) {
            json = 1;

        } else if (ngx_strcmp(data, "default") != 0) {
            ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                               "unknown log format escaping \"%s\"", data);
            return NGX_CONF_ERROR;
        }

        s++;
    }

    for ( /* void */ ; s < args->nelts; s++) {

        i = 0;

        while (i < value[s].len) {

            op = ngx_array_push(ops);
            if (op == NULL) {
                return NGX_CONF_ERROR;
            }

            data = &value[s].data[i];

            if (value[s].data[i] == '$') {

                if (++i == value[s].len) {
                    goto invalid;
                }

                if (value[s].data[i] == '{') {
                    bracket = 1;

                    if (++i == value[s].len) {
                        goto invalid;
                    }

                    var.data = &value[s].data[i];

                } else {
                    bracket = 0;
                    var.data = &value[s].data[i];
                }

                for (var.len = 0; i < value[s].len; i++, var.len++) {
                    ch = value[s].data[i];

                    if (ch == '}' && bracket) {
                        i++;
                        bracket = 0;
                        break;
                    }

                    if ((ch >= 'A' && ch <= 'Z')
                        || (ch >= 'a' && ch <= 'z')
                        || (ch >= '0' && ch <= '9')
                        || ch == '_')
                    {
                        continue;
                    }

                    break;
                }

                if (bracket) {
                    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                                       "the closing bracket in \"%V\" "
                                       "variable is missing", &var);
                    return NGX_CONF_ERROR;
                }

                if (var.len == 0) {
                    goto invalid;
                }

                for (v = ngx_http_log_vars; v->name.len; v++) {

                    if (v->name.len == var.len
                        && ngx_strncmp(v->name.data, var.data, var.len) == 0)
                    {
                        op->len = v->len;
                        op->getlen = NULL;
                        op->run = v->run;
                        op->data = 0;

                        goto found;
                    }
                }

                if (ngx_http_log_variable_compile(cf, op, &var, json)
                    != NGX_OK)
                {
                    return NGX_CONF_ERROR;
                }

                if (flushes) {

                    flush = ngx_array_push(flushes);
                    if (flush == NULL) {
                        return NGX_CONF_ERROR;
                    }

                    *flush = op->data; /* variable index */
                }

            found:

                continue;
            }

            i++;

            while (i < value[s].len && value[s].data[i] != '$') {
                i++;
            }

            len = &value[s].data[i] - data;

            if (len) {

                op->len = len;
                op->getlen = NULL;

                if (len <= sizeof(uintptr_t)) {
                    op->run = ngx_http_log_copy_short;
                    op->data = 0;

                    while (len--) {
                        op->data <<= 8;
                        op->data |= data[len];
                    }

                } else {
                    op->run = ngx_http_log_copy_long;

                    p = ngx_pnalloc(cf->pool, len);
                    if (p == NULL) {
                        return NGX_CONF_ERROR;
                    }

                    ngx_memcpy(p, data, len);
                    op->data = (uintptr_t) p;
                }
            }
        }
    }

    return NGX_CONF_OK;

invalid:

    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0, "invalid parameter \"%s\"", data);

    return NGX_CONF_ERROR;
}